

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O0

adios2_error adios2_current_step(size_t *current_step,adios2_engine *engine)

{
  undefined8 uVar1;
  long *in_RSI;
  undefined8 *in_RDI;
  string *in_stack_00000018;
  adios2_engine *in_stack_00000020;
  Engine *engineCpp;
  allocator local_39;
  string local_38 [32];
  long *local_18;
  undefined8 *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"for adios2_engine, in call to adios2_current_step",&local_39);
  adios2::helper::CheckForNullptr<adios2_engine_const>(in_stack_00000020,in_stack_00000018);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  uVar1 = (**(code **)(*local_18 + 0x20))();
  *local_10 = uVar1;
  return adios2_error_none;
}

Assistant:

adios2_error adios2_current_step(size_t *current_step, const adios2_engine *engine)
{
    try
    {
        adios2::helper::CheckForNullptr(engine,
                                        "for adios2_engine, in call to adios2_current_step");

        const adios2::core::Engine *engineCpp =
            reinterpret_cast<const adios2::core::Engine *>(engine);

        *current_step = engineCpp->CurrentStep();
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_current_step"));
    }
}